

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Abc_Cex_t *
Saig_ManFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fNewOrder,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Saig_RefMan_t *p_00;
  Vec_Int_t *vReasons_00;
  Vec_Int_t *p_01;
  abctime aVar7;
  Abc_Cex_t *p_02;
  Vec_Int_t *vRes;
  abctime clk;
  Abc_Cex_t *pCare;
  Vec_Int_t *vReasons;
  Saig_RefMan_t *p;
  int fVerbose_local;
  int fNewOrder_local;
  int nInputs_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  Abc_Clock();
  aVar6 = Abc_Clock();
  p_00 = Saig_RefManStart(pAig,pCex,nInputs,fVerbose);
  vReasons_00 = Saig_RefManFindReason(p_00);
  if (fVerbose != 0) {
    Aig_ManPrintStats(p_00->pFrames);
  }
  p_01 = Saig_RefManReason2Inputs(p_00,vReasons_00);
  uVar2 = Aig_ManCiNum(p_00->pFrames);
  uVar3 = Vec_IntSize(vReasons_00);
  iVar4 = Saig_ManPiNum(p_00->pAig);
  iVar1 = p_00->nInputs;
  uVar5 = Vec_IntSize(p_01);
  printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",(ulong)uVar2,
         (ulong)uVar3,(ulong)(uint)(iVar4 - iVar1),(ulong)uVar5);
  Abc_Print(1,"%s =","Time");
  aVar7 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
  Vec_IntFree(p_01);
  p_02 = Saig_RefManReason2Cex(p_00,vReasons_00);
  Vec_IntFree(vReasons_00);
  Saig_RefManStop(p_00);
  if (fVerbose != 0) {
    Abc_CexPrintStats(pCex);
    Abc_CexPrintStats(p_02);
  }
  return p_02;
}

Assistant:

Abc_Cex_t * Saig_ManFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fNewOrder, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_RefManStart( pAig, pCex, nInputs, fVerbose );
    vReasons = Saig_RefManFindReason( p );

if ( fVerbose )
Aig_ManPrintStats( p->pFrames );

//    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );

        Vec_IntFree( vRes );

/*
        ////////////////////////////////////
        Vec_IntFree( vReasons );
        vReasons = Saig_RefManRefineWithSat( p, vRes );
        ////////////////////////////////////

        Vec_IntFree( vRes );
        vRes = Saig_RefManReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );

        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
*/
    }

    pCare = Saig_RefManReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_RefManStop( p );

if ( fVerbose )
Abc_CexPrintStats( pCex );
if ( fVerbose )
Abc_CexPrintStats( pCare );

    return pCare;
}